

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETime.cpp
# Opt level: O0

double CETime::CurrentUTC(void)

{
  rep rVar1;
  duration __d;
  double dVar2;
  double stop;
  double start;
  time_point millisec_start;
  tm midnight;
  time_t now_t;
  time_point now;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff78;
  duration<long,_std::ratio<1L,_1000000L>_> local_80;
  time_t in_stack_ffffffffffffff88;
  duration<long,_std::ratio<1L,_1000000L>_> local_68;
  time_point *in_stack_ffffffffffffffa0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_58;
  tm local_50;
  rep local_18;
  time_t local_10;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_8;
  
  local_18 = std::chrono::_V2::system_clock::now();
  local_8.__d.__r = (duration)(duration)local_18;
  local_10 = std::chrono::_V2::system_clock::to_time_t(in_stack_ffffffffffffffa0);
  gmtime_r(&local_10,&local_50);
  local_50.tm_hour = 0;
  local_50.tm_min = 0;
  local_50.tm_sec = 0;
  mktime(&local_50);
  local_58.__d.__r =
       (duration)std::chrono::_V2::system_clock::from_time_t(in_stack_ffffffffffffff88);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_since_epoch(&local_58);
  local_68.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                (in_stack_ffffffffffffff78);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_68);
  dVar2 = (double)rVar1 / 1000000.0;
  __d = std::chrono::
        time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        ::time_since_epoch(&local_8);
  local_80.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                (__d.__r);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_80);
  return ((double)rVar1 / 1000000.0 - dVar2) - (double)local_50.tm_gmtoff;
}

Assistant:

double CETime::CurrentUTC()
{
    // Construct time_t of this moment
    std::chrono::system_clock::time_point now(std::chrono::system_clock::now());
    std::time_t now_t(std::chrono::system_clock::to_time_t(
                        std::chrono::system_clock::time_point(now)));
    
    // Get the time at midnight
    struct tm midnight;
    gmtime_r(&now_t, &midnight) ;
    midnight.tm_hour = 0 ;
    midnight.tm_min = 0 ;
    midnight.tm_sec = 0 ;

    // Midnight object
    auto millisec_start(std::chrono::system_clock::from_time_t(mktime(&midnight)));

    double start = std::chrono::duration_cast<std::chrono::microseconds>(millisec_start.time_since_epoch()).count()/1000000.0 ;
    double stop  = std::chrono::duration_cast<std::chrono::microseconds>(now.time_since_epoch()).count()/1000000.0 ;
    
    // Return seconds and fractions of a second since midnight
    return stop-start-midnight.tm_gmtoff ;
}